

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_surf.cc
# Opt level: O1

void __thiscall hwtest::pgraph::anon_unknown_14::MthdSurfFormat::emulate_mthd(MthdSurfFormat *this)

{
  int iVar1;
  uint32_t uVar2;
  byte bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.card_type;
  if (iVar1 < 4) {
    uVar5 = (this->super_SingleMthdTest).super_MthdTest.val;
    bVar3 = (byte)((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_switch_a >>
                  0xe) & 0xc;
    uVar6 = 6;
    if ((uVar5 >> 0x10 & 1) != 0) {
      uVar6 = uVar5 & 1 ^ 5;
    }
    if ((uVar5 >> 0x18 & 1) == 0) {
      uVar6 = 7;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.surf_format =
         uVar6 << bVar3 |
         ~(7 << bVar3) & (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.surf_format
    ;
    return;
  }
  uVar4 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar5 = (this->super_SingleMthdTest).super_MthdTest.cls & 3;
  if ((int)uVar4 < 0x1010000) {
    if (uVar4 == 1) {
      uVar2 = (uint)(uVar5 != 3) * 5 + 2;
      uVar4 = 7;
LAB_001c4909:
      if (0x1f < iVar1) {
        uVar4 = uVar2;
      }
      goto LAB_001c4913;
    }
    if (uVar4 == 0x1000000) {
      uVar4 = 2 - (0x1f < iVar1 && uVar5 == 3);
      goto LAB_001c4913;
    }
  }
  else {
    if (uVar4 == 0x1010000) {
      uVar4 = 1;
      goto LAB_001c4913;
    }
    if (uVar4 == 0x1010001) {
      uVar2 = (uint)(uVar5 != 3) * 5 + 1;
      uVar4 = 6;
      goto LAB_001c4909;
    }
  }
  uVar4 = 0;
LAB_001c4913:
  pgraph_set_surf_format
            (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,uVar5,uVar4);
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type < 4) {
			int which = extr(exp.ctx_switch_a, 16, 2);
			int f = 1;
			if (extr(val, 0, 1))
				f = 0;
			if (!extr(val, 16, 1))
				f = 2;
			if (!extr(val, 24, 1))
				f = 3;
			insrt(exp.surf_format, 4*which, 3, f | 4);
		} else {
			int which = cls & 3;
			int fmt = 0;
			if (val == 1) {
				if (which == 3 && chipset.card_type >= 0x20)
					fmt = 2;
				else
					fmt = 7;
			} else if (val == 0x01010000) {
				fmt = 1;
			} else if (val == 0x01000000) {
				if (which == 3 && chipset.card_type >= 0x20)
					fmt = 1;
				else
					fmt = 2;
			} else if (val == 0x01010001) {
				if (which == 3 && chipset.card_type >= 0x20)
					fmt = 1;
				else
					fmt = 6;
			}
			pgraph_set_surf_format(&exp, which, fmt);
		}
	}